

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::DataPageHeaderV2::DataPageHeaderV2(DataPageHeaderV2 *this)

{
  *(undefined ***)this = &PTR__DataPageHeaderV2_017b54b8;
  this->definition_levels_byte_length = 0;
  this->repetition_levels_byte_length = 0;
  this->num_values = 0;
  this->num_nulls = 0;
  this->num_rows = 0;
  this->encoding = PLAIN;
  this->is_compressed = true;
  Statistics::Statistics(&this->statistics);
  this->__isset = (_DataPageHeaderV2__isset)(((byte)this->__isset & 0xfc) + 1);
  return;
}

Assistant:

DataPageHeaderV2::DataPageHeaderV2() noexcept
   : num_values(0),
     num_nulls(0),
     num_rows(0),
     encoding(static_cast<Encoding::type>(0)),
     definition_levels_byte_length(0),
     repetition_levels_byte_length(0),
     is_compressed(true) {
}